

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_terminal.cpp
# Opt level: O1

void __thiscall ImportInt64_ErrorOnMaxPlus1_Test::TestBody(ImportInt64_ErrorOnMaxPlus1_Test *this)

{
  undefined1 auVar1 [8];
  pointer *__ptr;
  char *message;
  char *in_R9;
  error_code eVar2;
  string __str;
  AssertionResult gtest_ar_;
  int64_t v;
  parser<pstore::exchange::import_ns::callbacks> parser;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  undefined1 local_108 [8];
  uint local_100;
  undefined4 uStack_fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  AssertHelper local_d8;
  not_null<long_*> local_d0;
  long local_c8;
  parser<pstore::exchange::import_ns::callbacks> local_c0;
  
  local_d0.ptr_ = &local_c8;
  local_c8 = 0;
  pstore::gsl::not_null<long_*>::ensure_invariant(&local_d0);
  anon_unknown.dwarf_4cbfbd::ImportInt64::make_json_int64_parser
            (&local_c0,&this->super_ImportInt64,local_d0);
  local_108 = (undefined1  [8])&local_f8;
  std::__cxx11::string::_M_construct((ulong)local_108,'\x13');
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,0x8000000000000000);
  auVar1 = local_108;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_e8,CONCAT44(uStack_fc,local_100));
  local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)auVar1;
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::
  input<pstore::gsl::span<char_const,_1l>>(&local_c0,(span<const_char,__1L> *)local_e8);
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(&local_c0);
  local_e8[0] = local_c0.error_._M_value != 0;
  local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (local_c0.error_._M_value == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_e8,(AssertionResult *)0x1df922,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_terminal.cpp"
               ,0xa0,(char *)local_108);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
    }
    if (local_110._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_110._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_e0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  }
  eVar2 = pstore::exchange::import_ns::make_error_code(number_too_large);
  local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)eVar2._M_cat;
  local_e8._0_4_ = eVar2._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_108,"parser.last_error ()",
             "make_error_code (error::number_too_large)",&local_c0.error_,(error_code *)local_e8);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if ((undefined8 *)CONCAT44(uStack_fc,local_100) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT44(uStack_fc,local_100);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_terminal.cpp"
               ,0xa1,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_fc,local_100) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_fc,local_100));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.string_._M_dataplus._M_p != &local_c0.string_.field_2) {
    operator_delete(local_c0.string_._M_dataplus._M_p,
                    local_c0.string_.field_2._M_allocated_capacity + 1);
  }
  if (local_c0.callbacks_.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.callbacks_.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_c0.stack_.c);
  if (local_c0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (ImportInt64, ErrorOnMaxPlus1) {
    auto v = std::int64_t{0};
    auto parser = make_json_int64_parser (&v);
    auto const expected =
        static_cast<std::uint64_t> (std::numeric_limits<std::int64_t>::max ()) + 1U;
    parser.input (std::to_string (expected));
    parser.eof ();

    // Check the result.
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (), make_error_code (error::number_too_large));
}